

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::ArraySchema::ArraySchema(ArraySchema *this,Schema *itemsSchema)

{
  type this_00;
  Schema *in_RSI;
  undefined8 *in_RDI;
  Node *in_stack_ffffffffffffffb8;
  Schema *in_stack_ffffffffffffffc0;
  
  operator_new(0x28);
  NodeArray::NodeArray((NodeArray *)in_stack_ffffffffffffffc0);
  Schema::Schema(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__ArraySchema_00236478;
  this_00 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 1));
  Schema::root(in_RSI);
  Node::addLeaf(this_00,(NodePtr *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

ArraySchema::ArraySchema(const Schema &itemsSchema) :
    Schema(new NodeArray)
{
    node_->addLeaf(itemsSchema.root());
}